

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

Node * CleanNode(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  Node *node_00;
  Node *pNVar2;
  AttVal **ppAVar3;
  Bool BVar4;
  uint uVar5;
  uint uVar6;
  AttVal *pAVar7;
  Dict *pDVar8;
  tmbstr ptVar9;
  AttVal *pAVar10;
  long lVar11;
  char *pcVar12;
  AttVal *pAVar13;
  TidyTriState state;
  Node **in_R8;
  Node *pNVar14;
  Node *next;
  tmbchar buf [256];
  Node *local_148;
  TidyTriState local_140;
  TidyTriState local_13c;
  tmbchar local_138 [12];
  char acStack_12c [252];
  
  state = *(TidyTriState *)((doc->config).value + 0x58);
  local_13c = *(TidyTriState *)((doc->config).value + 0x5c);
  local_148 = node;
  BVar4 = prvTidynodeIsElement(node);
joined_r0x00138ae5:
  if (BVar4 != no) {
    if (node == (Node *)0x0) goto LAB_00138b90;
    if (((node->tag != (Dict *)0x0) &&
        (((((TVar1 = node->tag->id, TVar1 == TidyTag_DIR || (TVar1 == TidyTag_UL)) ||
           (TVar1 == TidyTag_OL)) &&
          ((pNVar14 = node->content, pNVar14 != (Node *)0x0 && (pNVar14->next == (Node *)0x0)))) &&
         (pNVar14->tag != (Dict *)0x0)))) &&
       ((pNVar14->tag->id == TidyTag_LI && (pNVar14->implicit != no)))) {
      pDVar8 = prvTidyLookupTagDef(TidyTag_DIV);
      node->tag = pDVar8;
      (*doc->allocator->vtbl->free)(doc->allocator,node->element);
      ptVar9 = prvTidytmbstrdup(doc->allocator,"div");
      node->element = ptVar9;
      pcVar12 = "margin-left: 2em";
      goto LAB_00138fc5;
    }
    if (node == (Node *)0x0) {
LAB_00138b90:
      BVar4 = MergeNestedElements(doc,TidyTag_DIV,state,node,in_R8);
      if ((BVar4 != no) ||
         (BVar4 = MergeNestedElements(doc,TidyTag_SPAN,local_13c,node,in_R8), BVar4 != no))
      goto LAB_00138fd5;
      if (((node != (Node *)0x0) &&
          (((node->tag != (Dict *)0x0 && (uVar5 = node->tag->id - TidyTag_TABLE, uVar5 < 9)) &&
           ((0x125U >> (uVar5 & 0x1f) & 1) != 0)))) &&
         (pAVar7 = prvTidyAttrGetById(node,TidyAttr_BGCOLOR), pAVar7 != (AttVal *)0x0)) {
        prvTidytmbsnprintf(local_138,0x100,"background-color: %s");
        prvTidyRemoveAttribute(doc,node,pAVar7);
        prvTidyAddStyleProperty(doc,node,local_138);
      }
      BVar4 = CanApplyBlockStyle(node);
      if (BVar4 != no) {
        if ((((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
            (node->tag->id != TidyTag_CAPTION)) && (node->attributes != (AttVal *)0x0)) {
          pAVar7 = (AttVal *)0x0;
          pAVar13 = node->attributes;
          do {
            if ((pAVar13->dict != (Attribute *)0x0) && (pAVar13->dict->id == TidyAttr_ALIGN)) {
              pAVar10 = (AttVal *)&node->attributes;
              if (pAVar7 != (AttVal *)0x0) {
                pAVar10 = pAVar7;
              }
              pAVar10->next = pAVar13->next;
              ptVar9 = pAVar13->value;
              if (ptVar9 == (tmbstr)0x0) goto LAB_00138d93;
              local_140 = state;
              prvTidytmbstrcpy(local_138,"text-align: ");
              lVar11 = 0xc;
              goto LAB_00138d59;
            }
            ppAVar3 = &pAVar13->next;
            pAVar7 = pAVar13;
            pAVar13 = *ppAVar3;
          } while (*ppAVar3 != (AttVal *)0x0);
        }
        goto LAB_00138d9e;
      }
      goto LAB_00138db2;
    }
    pDVar8 = node->tag;
    if (((((pDVar8 == (Dict *)0x0) ||
          ((pDVar8->id != TidyTag_UL && ((pDVar8 == (Dict *)0x0 || (pDVar8->id != TidyTag_OL))))))
         || (pNVar14 = node->content, pNVar14 == (Node *)0x0)) ||
        (((pNVar14->next != (Node *)0x0 || (node_00 = pNVar14->content, node_00 == (Node *)0x0)) ||
         (node_00->tag != pDVar8)))) || (node_00->next != (Node *)0x0)) {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_CENTER)
         ) goto LAB_00138b90;
      RenameElem(doc,node,TidyTag_DIV);
      pcVar12 = "text-align: center";
LAB_00138ee7:
      prvTidyAddStyleProperty(doc,node,pcVar12);
      goto LAB_00138fd5;
    }
    node_00->prev = node->prev;
    node_00->next = node->next;
    node_00->parent = node->parent;
    local_148 = node_00;
    prvTidyFixNodeLinks(node_00);
    pNVar14->content = (Node *)0x0;
    prvTidyFreeNode(doc,pNVar14);
    node->next = (Node *)0x0;
    node->content = (Node *)0x0;
    prvTidyFreeNode(doc,node);
    pNVar14 = node_00->prev;
    if ((((pNVar14 != (Node *)0x0) && (pDVar8 = pNVar14->tag, pDVar8 != (Dict *)0x0)) &&
        ((pDVar8->id == TidyTag_UL || ((pDVar8 != (Dict *)0x0 && (pDVar8->id == TidyTag_OL)))))) &&
       (pNVar2 = pNVar14->last, pNVar2 != (Node *)0x0)) {
      pNVar14->next = node_00->next;
      prvTidyFixNodeLinks(pNVar14);
      node_00->parent = pNVar2;
      node_00->next = (Node *)0x0;
      node_00->prev = pNVar2->last;
      prvTidyFixNodeLinks(node_00);
      CleanNode(doc,node_00);
    }
  }
  return local_148;
  while (lVar11 = lVar11 + 1, lVar11 != 0x7f) {
LAB_00138d59:
    uVar6 = prvTidyToLower((int)ptVar9[lVar11 + -0xc]);
    local_138[lVar11] = (char)uVar6;
    if ((char)uVar6 == '\0') goto LAB_00138d7a;
  }
  lVar11 = 0x7f;
LAB_00138d7a:
  local_138[lVar11] = '\0';
  prvTidyAddStyleProperty(doc,node,local_138);
  state = local_140;
LAB_00138d93:
  prvTidyFreeAttribute(doc,pAVar13);
LAB_00138d9e:
  pNVar14 = node->content;
  if ((pNVar14 == (Node *)0x0) || (pNVar14->next != (Node *)0x0)) {
LAB_00138db2:
    BVar4 = CanApplyInlineStyle(node);
    if ((BVar4 != no) &&
       ((pNVar14 = node->content, pNVar14 != (Node *)0x0 && (pNVar14->next == (Node *)0x0)))) {
      pDVar8 = pNVar14->tag;
      lVar11 = 0;
      pcVar12 = "font-weight: bold";
      do {
        if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == *(TidyTagId *)((long)&DAT_0017cc80 + lVar11)))
        goto LAB_00138fae;
        pcVar12 = *(char **)((long)&PTR_anon_var_dwarf_35332_0017cca0 + lVar11);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x78);
      if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_FONT)) goto LAB_00138f6d;
    }
    if (((node->parent->content != node) || (node->next != (Node *)0x0)) ||
       ((BVar4 = CanApplyBlockStyle(node->parent), BVar4 == no &&
        (BVar4 = CanApplyInlineStyle(node->parent), BVar4 == no)))) {
      lVar11 = 0;
      pcVar12 = "font-weight: bold";
      do {
        if (((*(int *)((long)&DAT_0017cc90 + lVar11) != 0) && (node->tag != (Dict *)0x0)) &&
           (node->tag->id == *(TidyTagId *)((long)&DAT_0017cc80 + lVar11))) {
          RenameElem(doc,node,TidyTag_SPAN);
          goto LAB_00138ee7;
        }
        pcVar12 = *(char **)((long)&PTR_anon_var_dwarf_35332_0017cca0 + lVar11);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x78);
    }
    if (node->tag == (Dict *)0x0) {
      return local_148;
    }
    if (node->tag->id != TidyTag_FONT) {
      return local_148;
    }
    if (*(int *)((doc->config).value + 0x24) == 0) {
      if (((node->parent->content == node) && (node->next == (Node *)0x0)) &&
         (BVar4 = CanApplyBlockStyle(node->parent), BVar4 != no)) {
        return local_148;
      }
      AddFontStyles(doc,node,node->attributes);
      pAVar7 = node->attributes;
      pAVar13 = (AttVal *)0x0;
      while (pAVar10 = pAVar7, pAVar10 != (AttVal *)0x0) {
        pAVar7 = pAVar10->next;
        if ((pAVar10->dict == (Attribute *)0x0) || (pAVar10->dict->id != TidyAttr_STYLE)) {
          prvTidyFreeAttribute(doc,pAVar10);
        }
        else {
          pAVar10->next = (AttVal *)0x0;
          pAVar13 = pAVar10;
        }
      }
      node->attributes = pAVar13;
      RenameElem(doc,node,TidyTag_SPAN);
    }
    else {
      DiscardContainer(doc,node,&local_148);
    }
    goto LAB_00138fd5;
  }
  pDVar8 = pNVar14->tag;
  lVar11 = 0;
  pcVar12 = "font-weight: bold";
  do {
    if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == *(TidyTagId *)((long)&DAT_0017cc80 + lVar11)))
    goto LAB_00138fae;
    pcVar12 = *(char **)((long)&PTR_anon_var_dwarf_35332_0017cca0 + lVar11);
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x78);
  if ((pDVar8 == (Dict *)0x0) || (pDVar8->id != TidyTag_FONT)) goto LAB_00138db2;
LAB_00138f6d:
  MergeStyles(doc,node,pNVar14);
  AddFontStyles(doc,node,pNVar14->attributes);
  goto LAB_00138fca;
LAB_00138fae:
  MergeStyles(doc,node,pNVar14);
LAB_00138fc5:
  prvTidyAddStyleProperty(doc,node,pcVar12);
LAB_00138fca:
  StripOnlyChild(doc,node);
LAB_00138fd5:
  node = local_148;
  BVar4 = prvTidynodeIsElement(local_148);
  goto joined_r0x00138ae5;
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}